

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingLayeredCase::iterate
          (ImageBindingLayeredCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  GLenum GVar2;
  GLuint unit;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  int ndxB;
  int ndxA;
  Texture textureB;
  Texture textureA;
  string local_158;
  allocator<char> local_131;
  string local_130;
  ScopedLogSection local_110;
  ScopedLogSection superSection;
  int ndx;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  int maxImages;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  ImageBindingLayeredCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar5,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  section.m_log._0_4_ = -1;
  this_00 = (CallLogWrapper *)((long)&result.m_message.field_2 + 8);
  glu::CallLogWrapper::enableLogging(this_00,true);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x8f38,(GLint *)&section);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(GVar2,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x272);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Initial value",(allocator<char> *)((long)&superSection.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar5,&local_d8,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&superSection.m_log + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  for (superSection.m_log._0_4_ = 0; (int)superSection.m_log < (int)section.m_log;
      superSection.m_log._0_4_ = (int)superSection.m_log + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
              ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
               0x8f3c,(int)superSection.m_log,false,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"AfterSetting",&local_131)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"After setting",
             (allocator<char> *)&textureA.super_ObjectWrapper.field_0x17);
  tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar5,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&textureA.super_ObjectWrapper.field_0x17);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&textureB.super_ObjectWrapper.m_object,pRVar4
            );
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&ndxB,pRVar4);
  unit = (int)section.m_log / 2;
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&textureB.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindTexture
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xde1,dVar3);
  glu::CallLogWrapper::glTexStorage2D
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0xde1,1,0x8058,0x20,0x20);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(GVar2,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x284);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&textureB.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0,dVar3,0,'\0',0,35000,0x8d7c);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(GVar2,"bind unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x287);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&ndxB);
  glu::CallLogWrapper::glBindTexture
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c1a,dVar3);
  glu::CallLogWrapper::glTexStorage3D
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),0x8c1a,1,0x8058,0x20,0x20,4);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(GVar2,"gen tex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x28b);
  dVar3 = glu::ObjectWrapper::operator*((ObjectWrapper *)&ndxB);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),unit,dVar3,0,'\x01',2,35000,
             0x8d7c);
  GVar2 = glu::CallLogWrapper::glGetError((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::checkError(GVar2,"bind unit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x28e);
  deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8f3c,0,false,this->m_verifierType);
  deqp::gls::StateQueryUtil::verifyStateIndexedBoolean
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x8f3c,unit,true,this->m_verifierType);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&ndxB);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&textureB.super_ObjectWrapper.m_object);
  tcu::ScopedLogSection::~ScopedLogSection(&local_110);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

ImageBindingLayeredCase::IterateResult ImageBindingLayeredCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result		(m_testCtx.getLog(), " // ERROR: ");
	int						maxImages	= -1;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_IMAGE_UNITS, &maxImages);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial value");

		for (int ndx = 0; ndx < maxImages; ++ndx)
			verifyStateIndexedBoolean(result, gl, GL_IMAGE_BINDING_LAYERED, ndx, false, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	superSection	(m_testCtx.getLog(), "AfterSetting", "After setting");
		glu::Texture				textureA		(m_context.getRenderContext());
		glu::Texture				textureB		(m_context.getRenderContext());
		const int					ndxA			= 0;
		const int					ndxB			= maxImages / 2;

		gl.glBindTexture(GL_TEXTURE_2D, *textureA);
		gl.glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 32, 32);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen tex");

		gl.glBindImageTexture(ndxA, *textureA, 0, GL_FALSE, 0, GL_READ_ONLY, GL_RGBA8UI);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind unit");

		gl.glBindTexture(GL_TEXTURE_2D_ARRAY, *textureB);
		gl.glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_RGBA8, 32, 32, 4);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "gen tex");

		gl.glBindImageTexture(ndxB, *textureB, 0, GL_TRUE, 2, GL_READ_ONLY, GL_RGBA8UI);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "bind unit");

		verifyStateIndexedBoolean(result, gl, GL_IMAGE_BINDING_LAYERED, ndxA, false, m_verifierType);
		verifyStateIndexedBoolean(result, gl, GL_IMAGE_BINDING_LAYERED, ndxB, true, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}